

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O2

int cmListFileLexer_SetFileName(cmListFileLexer *lexer,char *name,cmListFileLexer_BOM *bom)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  cmListFileLexer_BOM cVar3;
  int iVar4;
  uchar b [2];
  fpos_t local_30;
  
  cmListFileLexerDestroy(lexer);
  iVar4 = 1;
  if (name == (char *)0x0) goto LAB_002b63e2;
  __stream = fopen(name,"rb");
  lexer->file = (FILE *)__stream;
  if (__stream == (FILE *)0x0) {
    iVar4 = 0;
    goto LAB_002b63e2;
  }
  if (bom == (cmListFileLexer_BOM *)0x0) goto LAB_002b63e2;
  sVar2 = fread(b,1,2,__stream);
  if (sVar2 == 2) {
    if (b[1] == 0xbb && b[0] == 0xef) {
      sVar2 = fread(b,1,1,__stream);
      if ((sVar2 != 1) || (b[0] != 0xbf)) goto LAB_002b63cc;
      cVar3 = cmListFileLexer_BOM_UTF8;
    }
    else if (b[1] == 0xff && b[0] == 0xfe) {
      cVar3 = cmListFileLexer_BOM_UTF16BE;
    }
    else if (b[0] == '\0' && b[1] == '\0') {
      sVar2 = fread(b,1,2,__stream);
      if (((sVar2 != 2) || (b[0] != 0xfe)) || (b[1] != 0xff)) goto LAB_002b63cc;
      cVar3 = cmListFileLexer_BOM_UTF32BE;
    }
    else {
      if (b[1] != 0xfe || b[0] != 0xff) goto LAB_002b63cc;
      fgetpos(__stream,&local_30);
      sVar2 = fread(b,1,2,__stream);
      if (((sVar2 == 2) && (b[0] == '\0')) && (b[1] == '\0')) {
        cVar3 = cmListFileLexer_BOM_UTF32LE;
      }
      else {
        iVar1 = fsetpos(__stream,&local_30);
        cVar3 = (uint)(iVar1 == 0) * 3 + cmListFileLexer_BOM_Broken;
      }
    }
  }
  else {
LAB_002b63cc:
    iVar1 = fseek(__stream,0,0);
    cVar3 = (cmListFileLexer_BOM)(iVar1 != 0);
  }
  *bom = cVar3;
LAB_002b63e2:
  cmListFileLexerInit(lexer);
  return iVar4;
}

Assistant:

int cmListFileLexer_SetFileName(cmListFileLexer* lexer, const char* name,
                                cmListFileLexer_BOM* bom)
{
  int result = 1;
  cmListFileLexerDestroy(lexer);
  if (name) {
#ifdef _WIN32
    wchar_t* wname = cmsysEncoding_DupToWide(name);
    lexer->file = _wfopen(wname, L"rb");
    free(wname);
#else
    lexer->file = fopen(name, "rb");
#endif
    if (lexer->file) {
      if (bom) {
        *bom = cmListFileLexer_ReadBOM(lexer->file);
      }
    } else {
      result = 0;
    }
  }
  cmListFileLexerInit(lexer);
  return result;
}